

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

void __thiscall
lzham::vector<lzham::lzcompressor::lzpriced_decision>::clear
          (vector<lzham::lzcompressor::lzpriced_decision> *this)

{
  void *in_RDX;
  
  if (this->m_p != (lzpriced_decision *)0x0) {
    lzham::lzham_free((lzham *)this->m_malloc_context,this->m_p,in_RDX);
    this->m_p = (lzpriced_decision *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            lzham_free(m_malloc_context, m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }